

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O1

void __thiscall PointRetractation::test_method(PointRetractation *this)

{
  Vector3d v;
  RealSpace R3;
  Point y;
  Point x;
  Matrix<double,_3,_1,_0,_3,_1> local_3a0;
  RealScalar local_388;
  undefined1 local_380;
  undefined8 local_378;
  shared_count sStack_370;
  Matrix<double,_3,_1,_0,_3,_1> *local_368;
  ulong uStack_360;
  undefined8 *local_358;
  char **local_350;
  undefined8 uStack_348;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_338;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  code *local_2e0 [11];
  void *local_288;
  void *local_278;
  Ref local_268 [8];
  void *local_260;
  ConstSubPoint local_250 [280];
  void *local_138;
  ConstSubPoint local_128 [272];
  
  mnf::RealSpace::RealSpace((RealSpace *)local_2e0,3);
  local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       1.0;
  local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       2.0;
  local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       3.0;
  mnf::Manifold::getZero();
  local_350 = (char **)0x0;
  uStack_348 = 0;
  local_368 = &local_3a0;
  uStack_360 = 3;
  mnf::Point::retractation(local_268);
  free(local_350);
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f0,0x41);
  mnf::SubPoint::value();
  local_388 = 1e-12;
  local_380 = Eigen::internal::
              isApprox_selector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_false>
              ::run(&local_3a0,&local_338,&local_388);
  local_378 = 0;
  sStack_370.pi_ = (sp_counted_base *)0x0;
  local_350 = &local_310;
  local_310 = "v.isApprox(y.value())";
  local_308 = "";
  uStack_360 = uStack_360 & 0xffffffffffffff00;
  local_368 = (Matrix<double,_3,_1,_0,_3,_1> *)&PTR__lazy_ostream_00129c08;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_318 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_370);
  mnf::ConstSubPoint::~ConstSubPoint(local_250);
  free(local_260);
  mnf::ConstSubPoint::~ConstSubPoint(local_128);
  free(local_138);
  local_2e0[0] = mnf::operator+;
  free(local_278);
  free(local_288);
  mnf::Manifold::~Manifold((Manifold *)local_2e0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(PointRetractation)
{
  RealSpace R3(3);
  Eigen::Vector3d v(1, 2, 3);
  Point x = R3.getZero();
  Point y = x.retractation(v);
  BOOST_CHECK(v.isApprox(y.value()));
}